

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_listen.c
# Opt level: O0

int main(int argc,char **argv)

{
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  amqp_rpc_reply_t x_04;
  amqp_rpc_reply_t x_05;
  long in_RSI;
  int in_EDI;
  amqp_envelope_t envelope;
  amqp_rpc_reply_t res;
  amqp_queue_declare_ok_t *r;
  amqp_bytes_t queuename;
  amqp_connection_state_t conn;
  amqp_socket_t *socket;
  char *bindingkey;
  char *exchange;
  int status;
  int port;
  char *hostname;
  undefined8 in_stack_fffffffffffffcc8;
  uint uVar2;
  undefined8 uVar1;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int x_06;
  undefined1 local_308 [8];
  char *in_stack_fffffffffffffd00;
  char *local_2f8;
  undefined8 in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [24];
  ulong local_290;
  size_t in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  undefined8 local_278;
  ulong in_stack_fffffffffffffd90;
  undefined8 local_268;
  uint local_260;
  ulong local_258;
  undefined8 local_250;
  int local_148;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  ulong local_108 [2];
  ulong local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined8 *local_98;
  ulong local_90 [4];
  undefined1 local_70 [32];
  undefined1 local_50 [16];
  undefined8 local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  int local_1c;
  undefined8 local_18;
  long local_10;
  int local_4;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  local_4 = 0;
  local_38 = 0;
  if (in_EDI < 5) {
    fprintf(_stderr,"Usage: amqp_listen host port exchange bindingkey\n");
    local_4 = 1;
  }
  else {
    local_18 = *(undefined8 *)(in_RSI + 8);
    local_10 = in_RSI;
    local_1c = atoi(*(char **)(in_RSI + 0x10));
    local_28 = *(undefined8 *)(local_10 + 0x18);
    local_30 = *(undefined8 *)(local_10 + 0x20);
    local_40 = amqp_new_connection();
    local_38 = amqp_tcp_socket_new(local_40);
    if (local_38 == 0) {
      die("creating TCP socket");
    }
    local_20 = amqp_socket_open(local_38,local_18,local_1c);
    if (local_20 != 0) {
      die("opening TCP socket");
    }
    amqp_login(local_70,local_40,"/",0,0x20000,0,(ulong)uVar2 << 0x20,"guest","guest");
    x.reply._0_8_ = in_stack_fffffffffffffd18;
    x._0_8_ = in_stack_fffffffffffffd10;
    x.reply.decoded = (void *)in_stack_fffffffffffffd20;
    x._24_8_ = in_stack_fffffffffffffd28;
    die_on_amqp_error(x,in_stack_fffffffffffffd00);
    amqp_channel_open(local_40,1);
    amqp_get_rpc_reply(local_90,local_40);
    x_00.reply._0_8_ = in_stack_fffffffffffffd18;
    x_00._0_8_ = in_stack_fffffffffffffd10;
    x_00.reply.decoded = (void *)in_stack_fffffffffffffd20;
    x_00._24_8_ = in_stack_fffffffffffffd28;
    die_on_amqp_error(x_00,in_stack_fffffffffffffd00);
    local_98 = (undefined8 *)
               amqp_queue_declare(local_40,1,_amqp_empty_bytes,_amqp_socket_open,0,0,
                                  local_90[0] & 0xffffffff00000000,1,_amqp_empty_table,_usleep);
    amqp_get_rpc_reply(local_b8,local_40);
    x_01.reply._0_8_ = in_stack_fffffffffffffd18;
    x_01._0_8_ = in_stack_fffffffffffffd10;
    x_01.reply.decoded = (void *)in_stack_fffffffffffffd20;
    x_01._24_8_ = in_stack_fffffffffffffd28;
    die_on_amqp_error(x_01,in_stack_fffffffffffffd00);
    local_c8 = amqp_bytes_malloc_dup(*local_98,local_98[1]);
    uVar1 = local_40;
    local_50 = local_c8;
    if (local_c8._8_8_ == 0) {
      fprintf(_stderr,"Out of memory while copying queue name");
      local_4 = 1;
    }
    else {
      local_d8 = amqp_cstring_bytes(local_28);
      local_e8 = amqp_cstring_bytes(local_30);
      amqp_queue_bind(uVar1,1,local_50._0_8_,local_50._8_8_,local_d8._0_8_,local_d8._8_8_,local_e8,
                      _amqp_empty_table,_usleep);
      amqp_get_rpc_reply(local_108,local_40);
      x_02.reply._0_8_ = in_stack_fffffffffffffd18;
      x_02._0_8_ = in_stack_fffffffffffffd10;
      x_02.reply.decoded = (void *)in_stack_fffffffffffffd20;
      x_02._24_8_ = in_stack_fffffffffffffd28;
      die_on_amqp_error(x_02,in_stack_fffffffffffffd00);
      amqp_basic_consume(local_40,1,local_50._0_8_,local_50._8_8_,_amqp_empty_bytes,
                         _amqp_socket_open,local_108[0] & 0xffffffff00000000,1,
                         local_f8 & 0xffffffff00000000,_amqp_empty_table,_usleep);
      amqp_get_rpc_reply(&local_128,local_40);
      x_03.reply._0_8_ = in_stack_fffffffffffffd18;
      x_03._0_8_ = in_stack_fffffffffffffd10;
      x_03.reply.decoded = (void *)in_stack_fffffffffffffd20;
      x_03._24_8_ = in_stack_fffffffffffffd28;
      die_on_amqp_error(x_03,in_stack_fffffffffffffd00);
      uVar1 = local_128;
      uVar3 = local_120;
      uVar4 = local_118;
      uVar5 = local_110;
      while( true ) {
        amqp_maybe_release_buffers(local_40);
        amqp_consume_message(local_2c8,local_40,local_2a8,0,0);
        local_148 = (int)local_2c8._0_8_;
        if (local_148 != 1) break;
        printf("Delivery %u, exchange %.*s routingkey %.*s\n",local_290 & 0xffffffff,
               (ulong)in_stack_fffffffffffffd80 & 0xffffffff,local_278,
               in_stack_fffffffffffffd90 & 0xffffffff,local_268,uVar1,uVar3,uVar4,uVar5);
        if ((local_260 & 0x8000) != 0) {
          printf("Content-type: %.*s\n",local_258 & 0xffffffff,local_250);
        }
        printf("----\n");
        amqp_dump(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        amqp_destroy_envelope(local_2a8);
      }
      amqp_channel_close(&stack0xfffffffffffffd18,local_40,1,200);
      x_04.reply._0_8_ = in_stack_fffffffffffffd18;
      x_04._0_8_ = in_stack_fffffffffffffd10;
      x_04.reply.decoded = (void *)in_stack_fffffffffffffd20;
      x_04._24_8_ = in_stack_fffffffffffffd28;
      die_on_amqp_error(x_04,in_stack_fffffffffffffd00);
      amqp_connection_close(local_308,local_40,200);
      x_05.reply._0_8_ = in_stack_fffffffffffffd18;
      x_05._0_8_ = in_stack_fffffffffffffd10;
      x_05.reply.decoded = (void *)in_stack_fffffffffffffd20;
      x_05._24_8_ = in_stack_fffffffffffffd28;
      die_on_amqp_error(x_05,in_stack_fffffffffffffd00);
      x_06 = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
      amqp_destroy_connection(local_40);
      die_on_error(x_06,local_2f8);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *bindingkey;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;

  amqp_bytes_t queuename;

  if (argc < 5) {
    fprintf(stderr, "Usage: amqp_listen host port exchange bindingkey\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  bindingkey = argv[4];

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  {
    amqp_queue_declare_ok_t *r = amqp_queue_declare(conn, 1, amqp_empty_bytes, 0, 0, 0, 1,
                                 amqp_empty_table);
    die_on_amqp_error(amqp_get_rpc_reply(conn), "Declaring queue");
    queuename = amqp_bytes_malloc_dup(r->queue);
    if (queuename.bytes == NULL) {
      fprintf(stderr, "Out of memory while copying queue name");
      return 1;
    }
  }

  amqp_queue_bind(conn, 1, queuename, amqp_cstring_bytes(exchange), amqp_cstring_bytes(bindingkey),
                  amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Binding queue");

  amqp_basic_consume(conn, 1, queuename, amqp_empty_bytes, 0, 1, 0, amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Consuming");

  {
    while (1) {
      amqp_rpc_reply_t res;
      amqp_envelope_t envelope;

      amqp_maybe_release_buffers(conn);

      res = amqp_consume_message(conn, &envelope, NULL, 0);

      if (AMQP_RESPONSE_NORMAL != res.reply_type) {
        break;
      }

      printf("Delivery %u, exchange %.*s routingkey %.*s\n",
             (unsigned) envelope.delivery_tag,
             (int) envelope.exchange.len, (char *) envelope.exchange.bytes,
             (int) envelope.routing_key.len, (char *) envelope.routing_key.bytes);

      if (envelope.message.properties._flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        printf("Content-type: %.*s\n",
               (int) envelope.message.properties.content_type.len,
               (char *) envelope.message.properties.content_type.bytes);
      }
      printf("----\n");

      amqp_dump(envelope.message.body.bytes, envelope.message.body.len);

      amqp_destroy_envelope(&envelope);
    }
  }

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");

  return 0;
}